

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Client.cpp
# Opt level: O3

String * __thiscall Client::getDebugInfo(String *__return_storage_ptr__,Client *this)

{
  usize *puVar1;
  ProxyLine *this_00;
  DirectLine *this_01;
  undefined1 auVar2 [16];
  bool bVar3;
  Socket *this_02;
  ulong uVar4;
  time_t tVar5;
  usize uVar6;
  char *pcVar7;
  Client *this_03;
  char *pcVar8;
  ulong uVar9;
  String local_90;
  uint local_64;
  char *local_60;
  String local_58;
  
  __return_storage_ptr__->data = &__return_storage_ptr__->_data;
  (__return_storage_ptr__->_data).ref = 0;
  (__return_storage_ptr__->_data).str = "<tr>";
  (__return_storage_ptr__->_data).len = 4;
  Socket::inetNtoA(&local_58,(this->_address).addr);
  local_60 = String::operator_cast_to_char_(&local_58);
  local_64 = (uint)(this->_address).port;
  this_02 = Server::Client::getSocket(this->_handle);
  uVar4 = Socket::getFileDescriptor(this_02);
  this_03 = this->_handle;
  bVar3 = Server::Client::isSuspended(this_03);
  pcVar8 = "active";
  if (bVar3) {
    pcVar8 = "suspended";
  }
  if (this->_lastReadActivity == 0) {
    uVar9 = 0xffffffff;
  }
  else {
    tVar5 = Time::time((time_t *)this_03);
    auVar2 = SEXT816(tVar5 - this->_lastReadActivity) * SEXT816(0x20c49ba5e353f7cf);
    uVar9 = (ulong)(uint)((int)(auVar2._8_8_ >> 7) - (auVar2._12_4_ >> 0x1f));
  }
  uVar6 = Server::Client::getSendBufferSize(this->_handle);
  pcVar7 = String::operator_cast_to_char_(&this->_destinationHostname);
  String::fromPrintf(&local_90,
                     "<td>%s:%hu</td><td>%d</td><td>%s</td><td>%d</td><td>%d</td><td>%s:%hu</td>",
                     local_60,(ulong)local_64,uVar4 & 0xffffffff,pcVar8,uVar9,uVar6,pcVar7,
                     (ulong)(this->_destination).port);
  String::append(__return_storage_ptr__,&local_90);
  if ((local_90.data)->ref != 0) {
    LOCK();
    puVar1 = &(local_90.data)->ref;
    *puVar1 = *puVar1 - 1;
    UNLOCK();
    if ((*puVar1 == 0) && (local_90.data != (Data *)0x0)) {
      operator_delete__(local_90.data);
    }
  }
  if ((local_58.data)->ref != 0) {
    LOCK();
    puVar1 = &(local_58.data)->ref;
    *puVar1 = *puVar1 - 1;
    UNLOCK();
    if ((*puVar1 == 0) && (local_58.data != (Data *)0x0)) {
      operator_delete__(local_58.data);
    }
  }
  this_00 = this->_proxyLine;
  this_01 = this->_directLine;
  if (this_01 == (DirectLine *)0x0 && this_00 != (ProxyLine *)0x0) {
    ProxyLine::getDebugInfo(&local_90,this_00);
    String::append(__return_storage_ptr__,&local_90);
    if ((local_90.data)->ref == 0) goto LAB_00105b46;
    LOCK();
    puVar1 = &(local_90.data)->ref;
    *puVar1 = *puVar1 - 1;
    uVar6 = *puVar1;
    UNLOCK();
  }
  else if (this_00 == (ProxyLine *)0x0 && this_01 != (DirectLine *)0x0) {
    DirectLine::getDebugInfo(&local_90,this_01);
    String::append(__return_storage_ptr__,&local_90);
    if ((local_90.data)->ref == 0) goto LAB_00105b46;
    LOCK();
    puVar1 = &(local_90.data)->ref;
    *puVar1 = *puVar1 - 1;
    uVar6 = *puVar1;
    UNLOCK();
  }
  else {
    local_90.data = &local_90._data;
    local_90._data.ref = 0;
    local_90._data.str = "<td>connecting</td>";
    local_90._data.len = 0x13;
    String::append(__return_storage_ptr__,&local_90);
    if ((local_90.data)->ref == 0) goto LAB_00105b46;
    LOCK();
    puVar1 = &(local_90.data)->ref;
    *puVar1 = *puVar1 - 1;
    uVar6 = *puVar1;
    UNLOCK();
  }
  if ((uVar6 == 0) && (local_90.data != (Data *)0x0)) {
    operator_delete__(local_90.data);
  }
LAB_00105b46:
  local_90.data = &local_90._data;
  local_90._data.ref = 0;
  local_90._data.str = "</tr>";
  local_90._data.len = 5;
  String::append(__return_storage_ptr__,&local_90);
  if ((local_90.data)->ref != 0) {
    LOCK();
    puVar1 = &(local_90.data)->ref;
    *puVar1 = *puVar1 - 1;
    UNLOCK();
    if ((*puVar1 == 0) && (local_90.data != (Data *)0x0)) {
      operator_delete__(local_90.data);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

String Client::getDebugInfo() const
{
    String result("<tr>");

    //<td>192.168.0.196:56269</td><td>77</td><td>active</td><td>8</td><td>k8s.pforgeipt.intra.airbusds.corp:443</td>",
    result += String::fromPrintf("<td>%s:%hu</td><td>%d</td><td>%s</td><td>%d</td><td>%d</td><td>%s:%hu</td>",
        (const char*)Socket::inetNtoA(_address.addr), _address.port, (int)_handle.getSocket().getFileDescriptor(),
        _handle.isSuspended() ? "suspended" : "active", _lastReadActivity ? (int)((Time::time() - _lastReadActivity) / 1000) : (int)-1,
        (int)_handle.getSendBufferSize(),
        (const char*)_destinationHostname, _destination.port);

    if (_proxyLine && !_directLine)
        result.append(_proxyLine->getDebugInfo());
    else if (_directLine && !_proxyLine)
        result.append(_directLine->getDebugInfo());
    else
        result.append(String("<td>connecting</td>"));

    result.append("</tr>");
    return result;
}